

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reactor.cpp
# Opt level: O2

int main(void)

{
  native_type __fd;
  native_type __fd_00;
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char c;
  int local_7c;
  event evs [3];
  native_type fds [2];
  error_code e;
  reactor r;
  
  iVar1 = 0;
  while (iVar1 != 6) {
    local_7c = iVar1;
    booster::aio::reactor::reactor(&r,iVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
    poVar2 = std::operator<<(poVar2,": ");
    booster::aio::reactor::name_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)evs);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)evs);
    std::_V2::system_category();
    iVar6 = (int)(event *)&r;
    booster::aio::reactor::select(iVar6,-1,(error_code *)0x1);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"e");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
    pair(fds);
    __fd_00 = fds[1];
    __fd = fds[0];
    booster::aio::reactor::select(iVar6,fds[0]);
    booster::aio::reactor::select(iVar6,__fd_00);
    iVar4 = (int)evs;
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==0");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    booster::aio::reactor::select(iVar6,__fd);
    booster::aio::reactor::select(iVar6,__fd_00);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==2");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x25);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if ((evs[1].fd != __fd_00 || evs[0].fd != __fd) && (evs[1].fd != __fd || evs[0].fd != __fd_00))
    {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,
                               "(evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a)");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x27);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==reactor::out");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x28);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[1].events != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[1].events==reactor::out");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x29);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    booster::aio::reactor::remove(&r,(char *)(ulong)(uint)__fd);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==1");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2b);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].fd != __fd_00) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].fd==b");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==reactor::out");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    c = 'x';
    send(__fd,&c,1,0);
    booster::aio::reactor::select(iVar6,__fd_00);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,1000)==1");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].fd != __fd_00) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].fd==b");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==reactor::in");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x34);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    booster::aio::reactor::select(iVar6,__fd_00);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==1");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].fd != __fd_00) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].fd==b");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 3) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==(reactor::out | reactor::in)");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    recv(__fd_00,&c,1,0);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==1");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].fd != __fd_00) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].fd==b");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3b);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==reactor::out");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3c);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    shutdown(__fd,2);
    close(__fd);
    booster::ptime::millisleep(100);
    iVar1 = booster::aio::reactor::poll((event *)&r,iVar4,3);
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"r.poll(evs,3,0)==1");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x44);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].fd != __fd_00) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].fd==b");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    if (evs[0].events != 3) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"evs[0].events==(reactor::out | reactor::in)");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    sVar3 = recv(__fd_00,&c,1,0);
    if ((int)sVar3 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar2 = std::operator<<(poVar2,"(res=recv(b,&c,1,0))==0");
      poVar2 = std::operator<<(poVar2," at ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48);
      std::endl<char,std::char_traits<char>>(poVar2);
      return_code = 1;
    }
    close(__fd_00);
    booster::aio::reactor::~reactor(&r);
    iVar1 = local_7c + 1;
  }
  if (return_code == 0) {
    poVar2 = (ostream *)&std::cout;
    pcVar5 = "Ok";
  }
  else {
    poVar2 = (ostream *)&std::cerr;
    pcVar5 = "Fail ";
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  return return_code;
}

Assistant:

int main()
{
	try {
		for(int type=reactor::use_default;type<=reactor::use_max;type++) {
			reactor r(type);

			std::cout << "Testing " << type << ": " << r.name() << std::endl;

			booster::system::error_code e;
			r.select(booster::aio::invalid_socket,booster::aio::reactor::in,e);
			TEST(e);

			native_type fds[2];
			pair(fds);
			native_type a=fds[0];
			native_type b=fds[1];
			r.select(a,reactor::in);
			r.select(b,reactor::in);
			reactor::event evs[3];
			TEST(r.poll(evs,3,0)==0);
			r.select(a,reactor::in | reactor::out);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==2);

			TEST((evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a));
			TEST(evs[0].events==reactor::out);
			TEST(evs[1].events==reactor::out);
			r.remove(a);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			char c='x';
			send(a,&c,1,0);

			r.select(b,reactor::in);
			TEST(r.poll(evs,3,1000)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::in);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			recv(b,&c,1,0);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			#ifdef SHUT_RDWR
			shutdown(a,SHUT_RDWR);
			#else
			shutdown(a,SD_BOTH);
			#endif
			closefd(a);
			booster::ptime::millisleep(100);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			int res;
			TEST((res=recv(b,&c,1,0))==0);
			closefd(b);
		}
	}
	catch(std::exception const &e) {
		std::cerr << "Error: "<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" <<std::endl;
	else
		std::cerr << "Fail " << std::endl;
	return return_code;
}